

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functionals.c
# Opt level: O1

int xc_functional_get_number(char *name)

{
  int iVar1;
  int iVar2;
  int iVar3;
  xc_functional_key_t *__s1;
  
  iVar1 = strncasecmp(name,"XC_",3);
  iVar3 = xc_functional_keys[0].number;
  if (xc_functional_keys[0].number == -1) {
LAB_001da70e:
    iVar3 = -1;
  }
  else {
    iVar2 = strcasecmp(xc_functional_keys[0].name,name + (ulong)(iVar1 == 0) * 3);
    if (iVar2 != 0) {
      __s1 = xc_functional_keys;
      do {
        __s1 = __s1 + 1;
        iVar3 = __s1->number;
        if (iVar3 == -1) goto LAB_001da70e;
        iVar2 = strcasecmp(__s1->name,name + (ulong)(iVar1 == 0) * 3);
      } while (iVar2 != 0);
    }
  }
  return iVar3;
}

Assistant:

int xc_functional_get_number(const char *name)
{
  int ii;
  int key=-1;
  const char *p;

  /* Does name begin with xc_? */
  if(strncasecmp(name,"XC_",3) == 0) {
    p=name+3;
  } else {
    p=name;
  }

  for(ii=0;;ii++){
    if(xc_functional_keys[ii].number == -1)
      break;
    if(strcasecmp(xc_functional_keys[ii].name, p) == 0){
      key = xc_functional_keys[ii].number;
      break;
    }
  }

  return key;
}